

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBStringList::split(CBStringList *this,CBString *b,CBString *s)

{
  undefined4 uVar1;
  uchar splitChar;
  byte bVar2;
  int iVar3;
  CBStringException *this_00;
  CBString local_e8;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  CBStringException bstr__cppwrapper_exception;
  int local_68;
  int i;
  int p;
  uchar c;
  anon_struct_64_1_bc116759 chrs;
  CBString *s_local;
  CBString *b_local;
  CBStringList *this_local;
  
  chrs.content[7] = (unsigned_long)s;
  iVar3 = CBString::length(s);
  if (iVar3 != 0) {
    iVar3 = CBString::length((CBString *)chrs.content[7]);
    if (iVar3 == 1) {
      splitChar = CBString::character((CBString *)chrs.content[7],0);
      split(this,b,splitChar);
    }
    else {
      for (bstr__cppwrapper_exception.msg.field_2._12_4_ = 0;
          (int)bstr__cppwrapper_exception.msg.field_2._12_4_ < 8;
          bstr__cppwrapper_exception.msg.field_2._12_4_ =
               bstr__cppwrapper_exception.msg.field_2._12_4_ + 1) {
        (&p + (long)(int)bstr__cppwrapper_exception.msg.field_2._12_4_ * 2)[0] = 0;
        (&p + (long)(int)bstr__cppwrapper_exception.msg.field_2._12_4_ * 2)[1] = 0;
      }
      for (bstr__cppwrapper_exception.msg.field_2._12_4_ = 0;
          uVar1 = bstr__cppwrapper_exception.msg.field_2._12_4_,
          iVar3 = CBString::length((CBString *)chrs.content[7]), (int)uVar1 < iVar3;
          bstr__cppwrapper_exception.msg.field_2._12_4_ =
               bstr__cppwrapper_exception.msg.field_2._12_4_ + 1) {
        bVar2 = CBString::character((CBString *)chrs.content[7],
                                    bstr__cppwrapper_exception.msg.field_2._12_4_);
        *(ulong *)(&p + (long)((int)(uint)bVar2 >> 5) * 2) =
             1L << (bVar2 & 0x1f) | *(ulong *)(&p + (long)((int)(uint)bVar2 >> 5) * 2);
      }
      local_68 = 0;
      do {
        bstr__cppwrapper_exception.msg.field_2._12_4_ = local_68;
        while ((uVar1 = bstr__cppwrapper_exception.msg.field_2._12_4_, iVar3 = CBString::length(b),
               (int)uVar1 < iVar3 &&
               (bVar2 = CBString::character(b,bstr__cppwrapper_exception.msg.field_2._12_4_),
               (*(ulong *)(&p + (long)((int)(uint)bVar2 >> 5) * 2) & 1L << (bVar2 & 0x1f)) == 0))) {
          bstr__cppwrapper_exception.msg.field_2._12_4_ =
               bstr__cppwrapper_exception.msg.field_2._12_4_ + 1;
        }
        if (local_68 <= (int)bstr__cppwrapper_exception.msg.field_2._12_4_) {
          CBString::CBString(&local_e8,(b->super_tagbstring).data + local_68,
                             bstr__cppwrapper_exception.msg.field_2._12_4_ - local_68);
          std::vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_>::push_back
                    ((vector<Bstrlib::CBString,_std::allocator<Bstrlib::CBString>_> *)this,&local_e8
                    );
          CBString::~CBString(&local_e8);
        }
        local_68 = bstr__cppwrapper_exception.msg.field_2._12_4_ + 1;
        iVar3 = CBString::length(b);
      } while (local_68 <= iVar3);
    }
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"CBString::Null splitstring failure",&local_b9);
  CBStringException::CBStringException((CBStringException *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,(CBStringException *)local_98);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBStringList::split (const CBString& b, const CBString& s) {
struct { unsigned long content[(1 << CHAR_BIT) / 32]; } chrs;
unsigned char c;
int p, i;

	if (s.length() == 0) bstringThrow ("Null splitstring failure");
	if (s.length() == 1) {
		this->split (b, s.character (0));
	} else {

		for (i=0; i < ((1 << CHAR_BIT) / 32); i++) chrs.content[i] = 0x0;
		for (i=0; i < s.length(); i++) {
			c = s.character (i);
			chrs.content[c >> 5] |= ((long)1) << (c & 31);
		}

		p = 0;
		do {
			for (i = p; i < b.length (); i++) {
				c = b.character (i);
				if (chrs.content[c >> 5] & ((long)1) << (c & 31)) break;
			}
			if (i >= p) this->push_back (CBString (&(b.data[p]), i - p));
			p = i + 1;
		} while (p <= b.length ());
	}
}